

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

SC_WireLoad * Abc_SclFetchWireLoadModel(SC_Lib *p,char *pWLoadUsed)

{
  int iVar1;
  int local_24;
  SC_WireLoad *pSStack_20;
  int i;
  SC_WireLoad *pWL;
  char *pWLoadUsed_local;
  SC_Lib *p_local;
  
  pSStack_20 = (SC_WireLoad *)0x0;
  if (pWLoadUsed == (char *)0x0) {
    __assert_fail("pWLoadUsed != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibUtil.c"
                  ,0x170,"SC_WireLoad *Abc_SclFetchWireLoadModel(SC_Lib *, char *)");
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(&p->vWireLoads), local_24 < iVar1; local_24 = local_24 + 1)
  {
    pSStack_20 = (SC_WireLoad *)Vec_PtrEntry(&p->vWireLoads,local_24);
    iVar1 = strcmp(pSStack_20->pName,pWLoadUsed);
    if (iVar1 == 0) break;
  }
  iVar1 = Vec_PtrSize(&p->vWireLoads);
  if (local_24 == iVar1) {
    Abc_Print(-1,"Cannot find wire load model \"%s\".\n",pWLoadUsed);
    exit(1);
  }
  return pSStack_20;
}

Assistant:

SC_WireLoad * Abc_SclFetchWireLoadModel( SC_Lib * p, char * pWLoadUsed )
{
    SC_WireLoad * pWL = NULL;
    int i;
    // Get the actual table and reformat it for 'wire_cap' output:
    assert( pWLoadUsed != NULL );
    SC_LibForEachWireLoad( p, pWL, i )
        if ( !strcmp(pWL->pName, pWLoadUsed) )
            break;
    if ( i == Vec_PtrSize(&p->vWireLoads) )
    {
        Abc_Print( -1, "Cannot find wire load model \"%s\".\n", pWLoadUsed );
        exit(1);
    }
//    printf( "Using wireload model \"%s\".\n", pWL->pName );
    return pWL;
}